

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordWCase::createInstance
          (BuiltinGlFragCoordWCase *this,Context *context)

{
  ShaderRenderCaseInstance *this_00;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x220);
  ShaderRenderCaseInstance::ShaderRenderCaseInstance(this_00,context);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bfe8f8;
  this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x400000003fd9999a;
  this_00[1].super_TestInstance.m_context = (Context *)0x3f8000003f99999a;
  this_00->m_colorFormat = VK_FORMAT_R16G16B16A16_UNORM;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* BuiltinGlFragCoordWCase::createInstance (Context& context) const
{
	return new BuiltinGlFragCoordWCaseInstance(context);
}